

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_document_start_event_initialize
              (yaml_event_t *event,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int implicit)

{
  yaml_char_t *__ptr;
  int iVar1;
  yaml_version_directive_t *__ptr_00;
  yaml_tag_directive_t *pyVar2;
  size_t sVar3;
  yaml_char_t *pyVar4;
  yaml_char_t *pyVar5;
  yaml_tag_directive_t *pyVar6;
  yaml_tag_directive_t *pyVar7;
  yaml_tag_directive_t *pyVar8;
  yaml_tag_directive_t *ptr;
  long lVar9;
  yaml_mark_t mark;
  
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d0,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  if ((tag_directives_start != tag_directives_end) &&
     (tag_directives_start == (yaml_tag_directive_t *)0x0 ||
      tag_directives_end == (yaml_tag_directive_t *)0x0)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d2,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  __ptr_00 = (yaml_version_directive_t *)0x0;
  if (version_directive != (yaml_version_directive_t *)0x0) {
    __ptr_00 = (yaml_version_directive_t *)malloc(8);
    if (__ptr_00 == (yaml_version_directive_t *)0x0) {
      return 0;
    }
    *__ptr_00 = *version_directive;
  }
  if (tag_directives_start == tag_directives_end) {
    pyVar6 = (yaml_tag_directive_t *)0x0;
    pyVar7 = (yaml_tag_directive_t *)0x0;
  }
  else {
    pyVar2 = (yaml_tag_directive_t *)malloc(0x100);
    if (pyVar2 == (yaml_tag_directive_t *)0x0) {
      ptr = (yaml_tag_directive_t *)0x0;
      pyVar2 = (yaml_tag_directive_t *)0x0;
      pyVar4 = (yaml_char_t *)0x0;
      pyVar5 = (yaml_char_t *)0x0;
LAB_00104306:
      if (__ptr_00 != (yaml_version_directive_t *)0x0) {
        free(__ptr_00);
      }
      for (; ptr != pyVar2; pyVar2 = pyVar2 + -1) {
        __ptr = pyVar2[-1].prefix;
        if (pyVar2[-1].handle != (yaml_char_t *)0x0) {
          free(pyVar2[-1].handle);
        }
        if (__ptr != (yaml_char_t *)0x0) {
          free(__ptr);
        }
      }
      if (ptr != (yaml_tag_directive_t *)0x0) {
        free(ptr);
      }
      if (pyVar4 != (yaml_char_t *)0x0) {
        free(pyVar4);
      }
      if (pyVar5 == (yaml_char_t *)0x0) {
        return 0;
      }
      free(pyVar5);
      return 0;
    }
    pyVar8 = pyVar2 + 0x10;
    ptr = pyVar2;
    do {
      pyVar4 = tag_directives_start->handle;
      if (pyVar4 == (yaml_char_t *)0x0) {
        __assert_fail("tag_directive->handle",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                      ,0x2e2,
                      "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                     );
      }
      pyVar5 = tag_directives_start->prefix;
      if (pyVar5 == (yaml_char_t *)0x0) {
        __assert_fail("tag_directive->prefix",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                      ,0x2e3,
                      "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                     );
      }
      sVar3 = strlen((char *)pyVar4);
      iVar1 = yaml_check_utf8(pyVar4,sVar3);
      if (iVar1 == 0) {
LAB_001042fa:
        pyVar4 = (yaml_char_t *)0x0;
        pyVar5 = (yaml_char_t *)0x0;
        goto LAB_00104306;
      }
      sVar3 = strlen((char *)pyVar5);
      iVar1 = yaml_check_utf8(pyVar5,sVar3);
      if (iVar1 == 0) goto LAB_001042fa;
      pyVar4 = (yaml_char_t *)strdup((char *)pyVar4);
      pyVar5 = (yaml_char_t *)strdup((char *)pyVar5);
      if ((pyVar4 == (yaml_char_t *)0x0) || (pyVar5 == (yaml_char_t *)0x0)) goto LAB_00104306;
      pyVar6 = ptr;
      if (pyVar2 == pyVar8) {
        lVar9 = (long)pyVar2 - (long)ptr;
        if (0x3ffffffe < lVar9) goto LAB_00104306;
        pyVar6 = (yaml_tag_directive_t *)yaml_realloc(ptr,lVar9 * 2);
        if (pyVar6 == (yaml_tag_directive_t *)0x0) goto LAB_00104306;
        pyVar2 = (yaml_tag_directive_t *)(lVar9 + (long)pyVar6);
        pyVar8 = (yaml_tag_directive_t *)(lVar9 * 2 + (long)pyVar6);
      }
      pyVar7 = pyVar2 + 1;
      pyVar2->handle = pyVar4;
      pyVar2->prefix = pyVar5;
      tag_directives_start = tag_directives_start + 1;
      pyVar2 = pyVar7;
      ptr = pyVar6;
    } while (tag_directives_start != tag_directives_end);
  }
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  event->type = YAML_DOCUMENT_START_EVENT;
  (event->start_mark).index = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->end_mark).column = 0;
  (event->data).document_start.version_directive = __ptr_00;
  (event->data).document_start.tag_directives.start = pyVar6;
  (event->data).document_start.tag_directives.end = pyVar7;
  (event->data).document_start.implicit = implicit;
  return 1;
}

Assistant:

YAML_DECLARE(int)
yaml_document_start_event_initialize(yaml_event_t *event,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };

    assert(event);          /* Non-NULL event object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_START_EVENT_INIT(*event, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            implicit, mark, mark);

    return 1;

error:
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}